

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_toggle.c
# Opt level: O0

void * toggle_new(t_symbol *s,int argc,t_atom *argv)

{
  undefined4 uVar1;
  int iVar2;
  t_iemgui *iemgui;
  _glist *p_Var3;
  t_float tVar4;
  t_float local_134;
  undefined1 local_110 [8];
  t_iemgui_drawfunctions w;
  char str [144];
  float local_40;
  t_float nonzero;
  t_float on;
  int fs;
  int ldy;
  int ldx;
  int f;
  int a;
  t_toggle *x;
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  
  iemgui = iemgui_new(toggle_class);
  p_Var3 = canvas_getcurrent();
  iVar2 = sys_zoomfontheight(p_Var3->gl_font,1,0);
  ldx = iVar2 + 5;
  fs = 0;
  p_Var3 = canvas_getcurrent();
  iVar2 = sys_zoomfontheight(p_Var3->gl_font,1,0);
  on = (t_float)(int)((double)((iVar2 + 5) * -8) / 15.0);
  nonzero = (t_float)iemgui->x_fontsize;
  local_40 = 0.0;
  str[0x8c] = '\0';
  str[0x8d] = '\0';
  str[0x8e] = -0x80;
  str[0x8f] = '?';
  local_110 = (undefined1  [8])toggle_draw_new;
  w.draw_new = toggle_draw_config;
  w.draw_config = (t_iemdrawfunptr)0x0;
  w.draw_iolets = toggle_draw_update;
  w.draw_update = toggle_draw_select;
  w.draw_select = (t_iemdrawfunptr)0x0;
  w.draw_erase = (t_iemdrawfunptr)0x0;
  iemgui_setdrawfunctions(iemgui,(t_iemgui_drawfunctions *)local_110);
  if ((((((argc == 0xd) || (argc == 0xe)) && (argv->a_type == A_FLOAT)) &&
       (argv[1].a_type == A_FLOAT)) &&
      (((argv[2].a_type == A_SYMBOL || (argv[2].a_type == A_FLOAT)) &&
       ((argv[3].a_type == A_SYMBOL || (argv[3].a_type == A_FLOAT)))))) &&
     (((argv[4].a_type == A_SYMBOL || (argv[4].a_type == A_FLOAT)) &&
      ((argv[5].a_type == A_FLOAT &&
       ((((argv[6].a_type == A_FLOAT && (argv[7].a_type == A_FLOAT)) && (argv[8].a_type == A_FLOAT))
        && (argv[0xc].a_type == A_FLOAT)))))))) {
    tVar4 = atom_getfloatarg(0,argc,argv);
    ldx = (int)tVar4;
    tVar4 = atom_getfloatarg(1,argc,argv);
    iem_inttosymargs(&iemgui->x_isa,(int)tVar4);
    iemgui_new_getnames(iemgui,2,argv);
    tVar4 = atom_getfloatarg(5,argc,argv);
    fs = (int)tVar4;
    tVar4 = atom_getfloatarg(6,argc,argv);
    on = (t_float)(int)tVar4;
    tVar4 = atom_getfloatarg(7,argc,argv);
    iem_inttofstyle(&iemgui->x_fsf,(int)tVar4);
    tVar4 = atom_getfloatarg(8,argc,argv);
    nonzero = (t_float)(int)tVar4;
    iemgui_all_loadcolors(iemgui,argv + 9,argv + 10,argv + 0xb);
    local_40 = atom_getfloatarg(0xc,argc,argv);
  }
  else {
    iemgui_new_getnames(iemgui,2,(t_atom *)0x0);
  }
  if ((argc == 0xe) && (argv[0xd].a_type == A_FLOAT)) {
    str._140_4_ = atom_getfloatarg(0xd,0xe,argv);
  }
  iemgui->x_fsf =
       (t_iem_fstyle_flags)
       ((uint)iemgui->x_fsf & 0xffffff7f | (uint)(iemgui->x_snd != (t_symbol *)0x0) << 7);
  iemgui->x_fsf =
       (t_iem_fstyle_flags)
       ((uint)iemgui->x_fsf & 0xffffffbf | (uint)(iemgui->x_rcv != (t_symbol *)0x0) << 6);
  if (((uint)iemgui->x_fsf & 0x3f) == 1) {
    strcpy(iemgui->x_font,"helvetica");
  }
  else if (((uint)iemgui->x_fsf & 0x3f) == 2) {
    strcpy(iemgui->x_font,"times");
  }
  else {
    iemgui->x_fsf = (t_iem_fstyle_flags)((uint)iemgui->x_fsf & 0xffffffc0);
    strcpy(iemgui->x_font,sys_font);
  }
  uVar1 = str._140_4_;
  if (((float)str._140_4_ == 0.0) && (!NAN((float)str._140_4_))) {
    uVar1._0_1_ = '\0';
    uVar1._1_1_ = '\0';
    uVar1._2_1_ = -0x80;
    uVar1._3_1_ = '?';
  }
  *(undefined4 *)((long)&iemgui[1].x_obj.te_g.g_pd + 4) = uVar1;
  if (((uint)iemgui->x_isa & 1) == 0) {
    *(undefined4 *)&iemgui[1].x_obj.te_g.g_pd = 0;
  }
  else {
    if ((local_40 == 0.0) && (!NAN(local_40))) {
      str[0x8c] = '\0';
      str[0x8d] = '\0';
      str[0x8e] = '\0';
      str[0x8f] = '\0';
    }
    *(undefined4 *)&iemgui[1].x_obj.te_g.g_pd = str._140_4_;
  }
  if (((uint)iemgui->x_fsf >> 6 & 1) != 0) {
    pd_bind((t_pd *)iemgui,iemgui->x_rcv);
  }
  iemgui->x_ldx = fs;
  iemgui->x_ldy = (int)on;
  if ((int)nonzero < 4) {
    local_134 = 5.60519e-45;
  }
  else {
    local_134 = nonzero;
  }
  iemgui->x_fontsize = (int)local_134;
  iVar2 = iemgui_clip_size(ldx);
  iemgui->x_w = iVar2;
  iemgui->x_h = iemgui->x_w;
  iemgui_verify_snd_ne_rcv(iemgui);
  iemgui_newzoom(iemgui);
  outlet_new(&iemgui->x_obj,&s_float);
  return iemgui;
}

Assistant:

static void *toggle_new(t_symbol *s, int argc, t_atom *argv)
{
    t_toggle *x = (t_toggle *)iemgui_new(toggle_class);
    int a = IEM_GUI_DEFAULTSIZE, f = 0;
    int ldx = 0, ldy = -8 * IEM_GUI_DEFAULTSIZE_SCALE;
    int fs = x->x_gui.x_fontsize;
    t_float on = 0.0, nonzero = 1.0;
    char str[144];

    IEMGUI_SETDRAWFUNCTIONS(x, toggle);

    if(((argc == 13)||(argc == 14))&&IS_A_FLOAT(argv,0)
       &&IS_A_FLOAT(argv,1)
       &&(IS_A_SYMBOL(argv,2)||IS_A_FLOAT(argv,2))
       &&(IS_A_SYMBOL(argv,3)||IS_A_FLOAT(argv,3))
       &&(IS_A_SYMBOL(argv,4)||IS_A_FLOAT(argv,4))
       &&IS_A_FLOAT(argv,5)&&IS_A_FLOAT(argv,6)
       &&IS_A_FLOAT(argv,7)&&IS_A_FLOAT(argv,8)&&IS_A_FLOAT(argv,12))
    {
        a = (int)atom_getfloatarg(0, argc, argv);
        iem_inttosymargs(&x->x_gui.x_isa, atom_getfloatarg(1, argc, argv));
        iemgui_new_getnames(&x->x_gui, 2, argv);
        ldx = (int)atom_getfloatarg(5, argc, argv);
        ldy = (int)atom_getfloatarg(6, argc, argv);
        iem_inttofstyle(&x->x_gui.x_fsf, atom_getfloatarg(7, argc, argv));
        fs = (int)atom_getfloatarg(8, argc, argv);
        iemgui_all_loadcolors(&x->x_gui, argv+9, argv+10, argv+11);
        on = (t_float)atom_getfloatarg(12, argc, argv);
    }
    else iemgui_new_getnames(&x->x_gui, 2, 0);
    if((argc == 14)&&IS_A_FLOAT(argv,13))
        nonzero = (t_float)atom_getfloatarg(13, argc, argv);

    x->x_gui.x_fsf.x_snd_able = (0 != x->x_gui.x_snd);
    x->x_gui.x_fsf.x_rcv_able = (0 != x->x_gui.x_rcv);
    if(x->x_gui.x_fsf.x_font_style == 1) strcpy(x->x_gui.x_font, "helvetica");
    else if(x->x_gui.x_fsf.x_font_style == 2) strcpy(x->x_gui.x_font, "times");
    else { x->x_gui.x_fsf.x_font_style = 0;
        strcpy(x->x_gui.x_font, sys_font); }
    x->x_nonzero = (nonzero != 0.0) ? nonzero : 1.0;
    if(x->x_gui.x_isa.x_loadinit)
        x->x_on = (on != 0.0) ? nonzero : 0.0;
    else
        x->x_on = 0.0;
    if (x->x_gui.x_fsf.x_rcv_able)
        pd_bind(&x->x_gui.x_obj.ob_pd, x->x_gui.x_rcv);
    x->x_gui.x_ldx = ldx;
    x->x_gui.x_ldy = ldy;
    x->x_gui.x_fontsize = (fs < 4)?4:fs;
    x->x_gui.x_w = iemgui_clip_size(a);
    x->x_gui.x_h = x->x_gui.x_w;
    iemgui_verify_snd_ne_rcv(&x->x_gui);
    iemgui_newzoom(&x->x_gui);
    outlet_new(&x->x_gui.x_obj, &s_float);
    return (x);
}